

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O1

int __thiscall
ncnn::Interp::forward
          (Interp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint _w;
  uint _h;
  uint _c;
  Mat *pMVar5;
  Mat *this_00;
  size_t sVar6;
  size_t sVar7;
  float fVar8;
  float fVar9;
  int *piVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  void *pvVar14;
  void *pvVar15;
  uint uVar16;
  int *piVar17;
  ulong uVar18;
  long lVar19;
  int *piVar20;
  long lVar21;
  void *pvVar22;
  int *piVar23;
  int iVar24;
  void *pvVar25;
  long lVar26;
  ulong uVar27;
  uint uVar28;
  int iVar29;
  void *pvVar30;
  uint uVar31;
  void *pvVar32;
  int iVar33;
  float *rows3p;
  ulong uVar34;
  ulong uVar35;
  void *pvVar36;
  undefined4 *puVar37;
  float *pfVar38;
  uint uVar39;
  long lVar40;
  float *pfVar41;
  float *rows1p_2;
  long lVar42;
  long lVar43;
  long lVar44;
  void *pvVar45;
  float *rows3p_1;
  void *pvVar46;
  float fVar47;
  float fVar48;
  int iVar50;
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  Mat m_3;
  Mat rowsbuf2;
  Mat m_1;
  Mat m;
  Mat rowsbuf0;
  Mat rowsbuf1;
  Mat local_228;
  Mat local_1d8;
  int *local_188;
  long local_180;
  void *local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  int local_160;
  Allocator *local_158;
  undefined8 local_150;
  uint uStack_148;
  undefined4 uStack_144;
  int iStack_140;
  long local_138;
  void *local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  int local_110;
  Allocator *local_108;
  undefined8 local_100;
  int iStack_f8;
  undefined4 uStack_f4;
  int iStack_f0;
  long local_e8;
  Mat local_d8;
  Mat local_88;
  float *local_38;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar16 = pMVar5->w;
  uVar31 = pMVar5->h;
  uVar27 = (ulong)uVar31;
  sVar6 = pMVar5->elemsize;
  _w = pMVar5[1].w;
  lVar43 = (long)(int)_w;
  if (pMVar5->dims == 2) {
    if (_w != uVar16) {
      Mat::create(this_00,_w,uVar31,sVar6,opt->blob_allocator);
      pvVar22 = this_00->data;
      if (pvVar22 == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep == 0) {
        return -100;
      }
      if (this->resize_type == 2) {
        uVar34 = 0xffffffffffffffff;
        if (-1 < (int)_w) {
          uVar34 = lVar43 * 0xc;
        }
        piVar23 = (int *)operator_new__(uVar34);
        linear_coeffs(uVar16,_w,piVar23,(float *)(piVar23 + lVar43),this->align_corner);
        if (0 < (int)uVar31) {
          pvVar22 = pMVar5->data;
          iVar24 = pMVar5->w;
          sVar6 = pMVar5->elemsize;
          pvVar30 = this_00->data;
          iVar50 = this_00->w;
          sVar7 = this_00->elemsize;
          uVar34 = 0;
          do {
            if (0 < (int)_w) {
              uVar35 = 0;
              do {
                uVar3 = *(undefined8 *)(piVar23 + lVar43 + uVar35 * 2);
                uVar4 = *(undefined8 *)
                         ((long)pvVar22 + (long)piVar23[uVar35] * 4 + (long)iVar24 * sVar6 * uVar34)
                ;
                *(float *)((long)pvVar30 + uVar35 * 4) =
                     (float)((ulong)uVar4 >> 0x20) * (float)((ulong)uVar3 >> 0x20) +
                     (float)uVar4 * (float)uVar3;
                uVar35 = uVar35 + 1;
              } while (_w != uVar35);
            }
            uVar34 = uVar34 + 1;
            pvVar30 = (void *)((long)pvVar30 + (long)iVar50 * sVar7);
          } while (uVar34 != uVar27);
        }
        operator_delete__(piVar23);
      }
      else if (this->resize_type == 1) {
        if (_w == 0) {
          fVar47 = 1.0 / this->width_scale;
        }
        else {
          fVar47 = (float)(int)uVar16 / (float)(int)_w;
        }
        if (0 < (int)uVar31) {
          pvVar30 = pMVar5->data;
          iVar24 = pMVar5->w;
          sVar6 = pMVar5->elemsize;
          iVar50 = this_00->w;
          sVar7 = this_00->elemsize;
          uVar34 = 0;
          do {
            if (0 < (int)_w) {
              lVar40 = 0;
              do {
                iVar29 = (int)((float)(int)lVar40 * fVar47);
                iVar33 = uVar16 - 1;
                if (iVar29 <= (int)(uVar16 - 1)) {
                  iVar33 = iVar29;
                }
                *(undefined4 *)((long)pvVar22 + lVar40 * 4) =
                     *(undefined4 *)
                      ((long)pvVar30 + (long)iVar33 * 4 + (long)iVar24 * sVar6 * uVar34);
                lVar40 = lVar40 + 1;
              } while (_w != (uint)lVar40);
            }
            uVar34 = uVar34 + 1;
            pvVar22 = (void *)((long)pvVar22 + (long)iVar50 * sVar7);
          } while (uVar34 != uVar27);
        }
      }
      if (this->resize_type != 3) {
        return 0;
      }
      uVar34 = 0xffffffffffffffff;
      if (-1 < (int)_w) {
        uVar34 = lVar43 * 0x14;
      }
      piVar23 = (int *)operator_new__(uVar34);
      cubic_coeffs(uVar16,_w,piVar23,(float *)(piVar23 + lVar43),this->align_corner);
      if (0 < (int)uVar31) {
        pvVar22 = pMVar5->data;
        iVar24 = pMVar5->w;
        sVar6 = pMVar5->elemsize;
        pvVar30 = this_00->data;
        iVar50 = this_00->w;
        sVar7 = this_00->elemsize;
        uVar34 = 0;
        do {
          if (0 < (int)_w) {
            lVar40 = 0;
            do {
              pfVar41 = (float *)(piVar23 + lVar43 + lVar40);
              pfVar38 = (float *)((long)pvVar22 +
                                 (long)*(int *)((long)piVar23 + lVar40) * 4 +
                                 (long)iVar24 * sVar6 * uVar34 + -4);
              *(float *)((long)pvVar30 + lVar40) =
                   pfVar38[3] * pfVar41[3] + pfVar38[1] * pfVar41[1] +
                   pfVar38[2] * pfVar41[2] + *pfVar38 * *pfVar41;
              lVar40 = lVar40 + 4;
            } while ((ulong)_w << 2 != lVar40);
          }
          uVar34 = uVar34 + 1;
          pvVar30 = (void *)((long)pvVar30 + (long)iVar50 * sVar7);
        } while (uVar34 != uVar27);
      }
      operator_delete__(piVar23);
      return 0;
    }
  }
  else {
    _h = pMVar5[1].h;
    lVar40 = (long)(int)_h;
    if (pMVar5->dims == 1) {
      Mat::create(this_00,_w,_h,uVar16,sVar6,opt->blob_allocator);
      auVar13 = _DAT_00326370;
      auVar12 = _DAT_00323020;
      auVar11 = _DAT_00323010;
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if ((int)uVar16 < 1) {
          return 0;
        }
        iVar24 = this_00->dims;
        pvVar22 = pMVar5->data;
        uVar27 = 0;
        do {
          if (iVar24 == 3) {
            pvVar30 = (void *)(this_00->cstep * uVar27 * this_00->elemsize + (long)this_00->data);
            iVar33 = this_00->h * this_00->w;
            iVar50 = 1;
          }
          else {
            iVar50 = this_00->d;
            pvVar30 = (void *)(this_00->cstep * uVar27 * this_00->elemsize + (long)this_00->data);
            iVar33 = this_00->h * this_00->w;
          }
          uVar31 = iVar50 * iVar33;
          if (0 < (int)uVar31) {
            uVar2 = *(undefined4 *)((long)pvVar22 + uVar27 * 4);
            lVar43 = (ulong)uVar31 - 1;
            auVar49._8_4_ = (int)lVar43;
            auVar49._0_8_ = lVar43;
            auVar49._12_4_ = (int)((ulong)lVar43 >> 0x20);
            auVar49 = auVar49 ^ auVar12;
            uVar34 = 0;
            do {
              auVar51._8_4_ = (int)uVar34;
              auVar51._0_8_ = uVar34;
              auVar51._12_4_ = (int)(uVar34 >> 0x20);
              auVar52 = (auVar51 | auVar11) ^ auVar12;
              iVar50 = auVar49._4_4_;
              if ((bool)(~(iVar50 < auVar52._4_4_ ||
                          auVar49._0_4_ < auVar52._0_4_ && auVar52._4_4_ == iVar50) & 1)) {
                *(undefined4 *)((long)pvVar30 + uVar34 * 4) = uVar2;
              }
              if (auVar52._12_4_ <= auVar49._12_4_ &&
                  (auVar52._8_4_ <= auVar49._8_4_ || auVar52._12_4_ != auVar49._12_4_)) {
                *(undefined4 *)((long)pvVar30 + uVar34 * 4 + 4) = uVar2;
              }
              auVar51 = (auVar51 | auVar13) ^ auVar12;
              iVar33 = auVar51._4_4_;
              if (iVar33 <= iVar50 && (iVar33 != iVar50 || auVar51._0_4_ <= auVar49._0_4_)) {
                *(undefined4 *)((long)pvVar30 + uVar34 * 4 + 8) = uVar2;
                *(undefined4 *)((long)pvVar30 + uVar34 * 4 + 0xc) = uVar2;
              }
              uVar34 = uVar34 + 4;
            } while ((uVar31 + 3 & 0xfffffffc) != uVar34);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != uVar16);
        return 0;
      }
      return -100;
    }
    if (uVar31 != _h || _w != uVar16) {
      _c = pMVar5->c;
      uVar27 = (ulong)_c;
      Mat::create(this_00,_w,_h,_c,sVar6,opt->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return -100;
      }
      if ((long)this_00->c * this_00->cstep != 0) {
        if (this->resize_type == 1) {
          if (_h == 0) {
            fVar47 = 1.0 / this->height_scale;
          }
          else {
            fVar47 = (float)(int)uVar31 / (float)(int)_h;
          }
          if (_w == 0) {
            fVar48 = 1.0 / this->width_scale;
          }
          else {
            fVar48 = (float)(int)uVar16 / (float)(int)_w;
          }
          if (0 < (int)_c) {
            pvVar22 = pMVar5->data;
            sVar6 = pMVar5->cstep;
            sVar7 = pMVar5->elemsize;
            uVar34 = 0;
            do {
              if (0 < (int)_h) {
                puVar37 = (undefined4 *)
                          (this_00->cstep * uVar34 * this_00->elemsize + (long)this_00->data);
                uVar39 = 0;
                do {
                  if (0 < (int)_w) {
                    iVar24 = (int)((float)(int)uVar39 * fVar47);
                    if ((int)(uVar31 - 1) < (int)((float)(int)uVar39 * fVar47)) {
                      iVar24 = uVar31 - 1;
                    }
                    uVar28 = 0;
                    do {
                      iVar50 = uVar16 - 1;
                      if ((int)((float)(int)uVar28 * fVar48) <= (int)(uVar16 - 1)) {
                        iVar50 = (int)((float)(int)uVar28 * fVar48);
                      }
                      *puVar37 = *(undefined4 *)
                                  ((long)pvVar22 +
                                  (long)(int)(iVar50 + iVar24 * uVar16) * 4 + sVar6 * sVar7 * uVar34
                                  );
                      puVar37 = puVar37 + 1;
                      uVar28 = uVar28 + 1;
                    } while (_w != uVar28);
                  }
                  uVar39 = uVar39 + 1;
                } while (uVar39 != _h);
              }
              uVar34 = uVar34 + 1;
            } while (uVar34 != uVar27);
          }
        }
        if (this->resize_type == 2) {
          iVar24 = _w * 3 + _h * 3;
          uVar34 = 0xffffffffffffffff;
          if (-1 < iVar24) {
            uVar34 = (long)iVar24 * 4;
          }
          piVar17 = (int *)operator_new__(uVar34);
          piVar23 = piVar17 + lVar43;
          pfVar41 = (float *)(piVar23 + lVar40);
          iVar24 = this->align_corner;
          linear_coeffs(uVar16,_w,piVar17,pfVar41,iVar24);
          linear_coeffs(uVar31,_h,piVar23,pfVar41 + lVar43 * 2,iVar24);
          if (0 < (int)_c) {
            uVar34 = 0;
            do {
              local_1d8.w = pMVar5->w;
              local_1d8.h = pMVar5->h;
              if (pMVar5->dims == 3) {
                sVar6 = pMVar5->elemsize;
                local_1d8.data = (void *)(pMVar5->cstep * uVar34 * sVar6 + (long)pMVar5->data);
                local_1d8.elempack = pMVar5->elempack;
                local_1d8.allocator = pMVar5->allocator;
                local_1d8.elemsize._0_4_ = (undefined4)sVar6;
                local_1d8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
                local_1d8.dims = 2;
                local_1d8.c = 1;
              }
              else {
                local_1d8.c = pMVar5->d;
                sVar6 = pMVar5->elemsize;
                local_1d8.data = (void *)(pMVar5->cstep * uVar34 * sVar6 + (long)pMVar5->data);
                local_1d8.elempack = pMVar5->elempack;
                local_1d8.allocator = pMVar5->allocator;
                local_1d8.elemsize._0_4_ = (undefined4)sVar6;
                local_1d8.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
                local_1d8.dims = 3;
              }
              local_1d8.d = 1;
              local_1d8.refcount._4_4_ = 0;
              local_1d8.refcount._0_4_ = 0;
              local_1d8.cstep = (long)local_1d8.h * (long)local_1d8.w;
              if (this_00->dims == 3) {
                uVar39 = this_00->w;
                sVar6 = this_00->elemsize;
                local_228.data = (void *)(this_00->cstep * uVar34 * sVar6 + (long)this_00->data);
                uVar28 = this_00->h;
                local_228.elempack = this_00->elempack;
                local_228.allocator = this_00->allocator;
                local_228.elemsize._0_4_ = (undefined4)sVar6;
                local_228.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
                local_228.dims = 2;
                local_228.c = 1;
              }
              else {
                uVar39 = this_00->w;
                uVar28 = this_00->h;
                local_228.c = this_00->d;
                sVar6 = this_00->elemsize;
                local_228.data = (void *)(this_00->cstep * uVar34 * sVar6 + (long)this_00->data);
                local_228.elempack = this_00->elempack;
                local_228.allocator = this_00->allocator;
                local_228.elemsize._0_4_ = (undefined4)sVar6;
                local_228.elemsize._4_4_ = (undefined4)(sVar6 >> 0x20);
                local_228.dims = 3;
              }
              local_228.d = 1;
              local_228.refcount._4_4_ = 0;
              local_228.refcount._0_4_ = 0;
              local_228.cstep = (long)(int)uVar28 * (long)(int)uVar39;
              local_d8.cstep = 0;
              local_d8.data = (void *)0x0;
              local_d8.refcount._0_4_ = 0;
              local_d8.refcount._4_4_ = 0;
              local_d8.elemsize._0_4_ = 0;
              local_d8._20_8_ = 0;
              local_d8.h = 0;
              local_d8.d = 0;
              local_d8.c = 0;
              local_d8.allocator = (Allocator *)0x0;
              local_d8.dims = 0;
              local_d8.w = 0;
              local_228.w = uVar39;
              local_228.h = uVar28;
              Mat::create(&local_d8,uVar39,4,(Allocator *)0x0);
              local_88.cstep = 0;
              local_88.data = (void *)0x0;
              local_88.refcount._0_4_ = 0;
              local_88.refcount._4_4_ = 0;
              local_88.elemsize._0_4_ = 0;
              local_88._20_8_ = 0;
              local_88.h = 0;
              local_88.d = 0;
              local_88.c = 0;
              local_88.allocator = (Allocator *)0x0;
              local_88.dims = 0;
              local_88.w = 0;
              Mat::create(&local_88,uVar39,4,(Allocator *)0x0);
              if (0 < (int)uVar28) {
                local_180 = (long)local_1d8.w *
                            CONCAT44(local_1d8.elemsize._4_4_,(undefined4)local_1d8.elemsize);
                local_188 = (int *)((long)local_228.w *
                                   CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize)
                                   );
                uVar35 = 0;
                pvVar22 = local_d8.data;
                pvVar32 = local_228.data;
                pfVar38 = pfVar41 + lVar43 * 2;
                pvVar30 = local_88.data;
                iVar24 = -2;
                do {
                  iVar50 = piVar23[uVar35];
                  pvVar25 = pvVar22;
                  if (iVar50 != iVar24) {
                    if (iVar50 == iVar24 + 1) {
                      pvVar25 = pvVar30;
                      pvVar30 = pvVar22;
                      if (0 < (int)uVar39) {
                        uVar18 = 0;
                        do {
                          uVar3 = *(undefined8 *)
                                   ((long)local_1d8.data +
                                   (long)piVar17[uVar18] * 4 + ((long)iVar50 + 1) * local_180);
                          *(float *)((long)pvVar22 + uVar18 * 4) =
                               (float)((ulong)uVar3 >> 0x20) *
                               (float)((ulong)*(undefined8 *)
                                               (piVar17 + lVar43 + lVar40 + uVar18 * 2) >> 0x20) +
                               (float)uVar3 *
                               (float)*(undefined8 *)(piVar17 + lVar43 + lVar40 + uVar18 * 2);
                          uVar18 = uVar18 + 1;
                        } while (uVar39 != uVar18);
                      }
                    }
                    else if (0 < (int)uVar39) {
                      uVar18 = 0;
                      do {
                        iVar24 = piVar17[uVar18];
                        uVar3 = *(undefined8 *)
                                 ((long)local_1d8.data + (long)iVar24 * 4 + iVar50 * local_180);
                        fVar47 = (float)*(undefined8 *)(piVar17 + lVar43 + lVar40 + uVar18 * 2);
                        fVar48 = (float)((ulong)*(undefined8 *)
                                                 (piVar17 + lVar43 + lVar40 + uVar18 * 2) >> 0x20);
                        *(float *)((long)pvVar22 + uVar18 * 4) =
                             (float)((ulong)uVar3 >> 0x20) * fVar48 + (float)uVar3 * fVar47;
                        uVar3 = *(undefined8 *)
                                 ((long)local_1d8.data + (long)iVar24 * 4 + (iVar50 + 1) * local_180
                                 );
                        *(float *)((long)pvVar30 + uVar18 * 4) =
                             (float)((ulong)uVar3 >> 0x20) * fVar48 + (float)uVar3 * fVar47;
                        uVar18 = uVar18 + 1;
                      } while (uVar39 != uVar18);
                    }
                  }
                  if (0 < (int)uVar39) {
                    fVar47 = *pfVar38;
                    fVar48 = pfVar38[1];
                    lVar19 = 0;
                    do {
                      *(float *)((long)pvVar32 + lVar19 * 4) =
                           *(float *)((long)pvVar30 + lVar19 * 4) * fVar48 +
                           *(float *)((long)pvVar25 + lVar19 * 4) * fVar47;
                      lVar19 = lVar19 + 1;
                    } while (uVar39 != (uint)lVar19);
                  }
                  pfVar38 = pfVar38 + 2;
                  uVar35 = uVar35 + 1;
                  pvVar32 = (void *)((long)pvVar32 + (long)local_188);
                  pvVar22 = pvVar25;
                  iVar24 = iVar50;
                } while (uVar35 != uVar28);
              }
              piVar20 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  if (local_88.allocator == (Allocator *)0x0) {
                    if (local_88.data != (void *)0x0) {
                      free(local_88.data);
                    }
                  }
                  else {
                    (*(local_88.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_88.cstep = 0;
              local_88.data = (void *)0x0;
              local_88.refcount._0_4_ = 0;
              local_88.refcount._4_4_ = 0;
              local_88.elemsize._0_4_ = 0;
              local_88._20_8_ = 0;
              local_88.dims = 0;
              local_88.w = 0;
              local_88.h = 0;
              local_88.d = 0;
              local_88.c = 0;
              piVar20 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  if (local_d8.allocator == (Allocator *)0x0) {
                    if (local_d8.data != (void *)0x0) {
                      free(local_d8.data);
                    }
                  }
                  else {
                    (*(local_d8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_d8.cstep = 0;
              local_d8.data = (void *)0x0;
              local_d8.refcount._0_4_ = 0;
              local_d8.refcount._4_4_ = 0;
              local_d8.elemsize._0_4_ = 0;
              local_d8._20_8_ = 0;
              local_d8.dims = 0;
              local_d8.w = 0;
              local_d8.h = 0;
              local_d8.d = 0;
              local_d8.c = 0;
              piVar20 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  if (local_228.allocator == (Allocator *)0x0) {
                    if (local_228.data != (void *)0x0) {
                      free(local_228.data);
                    }
                  }
                  else {
                    (*(local_228.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_228.cstep = 0;
              local_228.data = (void *)0x0;
              local_228.refcount._0_4_ = 0;
              local_228.refcount._4_4_ = 0;
              local_228.elemsize._0_4_ = 0;
              local_228.elemsize._4_4_ = 0;
              local_228.elempack = 0;
              local_228.dims = 0;
              local_228.w = 0;
              local_228.h = 0;
              local_228.d = 0;
              local_228.c = 0;
              piVar20 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  if (local_1d8.allocator == (Allocator *)0x0) {
                    if (local_1d8.data != (void *)0x0) {
                      free(local_1d8.data);
                    }
                  }
                  else {
                    (*(local_1d8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_1d8.cstep = 0;
              local_1d8.data = (void *)0x0;
              local_1d8.refcount._0_4_ = 0;
              local_1d8.refcount._4_4_ = 0;
              local_1d8.elemsize._0_4_ = 0;
              local_1d8.elemsize._4_4_ = 0;
              local_1d8.elempack = 0;
              local_1d8.dims = 0;
              local_1d8.w = 0;
              local_1d8.h = 0;
              local_1d8.d = 0;
              local_1d8.c = 0;
              uVar34 = uVar34 + 1;
            } while (uVar34 != uVar27);
          }
          operator_delete__(piVar17);
        }
        if (this->resize_type == 3) {
          iVar24 = _w * 5 + _h * 5;
          uVar34 = 0xffffffffffffffff;
          if (-1 < iVar24) {
            uVar34 = (long)iVar24 * 4;
          }
          piVar20 = (int *)operator_new__(uVar34);
          piVar23 = piVar20 + lVar43;
          local_38 = (float *)(piVar23 + lVar40 + (int)(_w * 4));
          iVar24 = this->align_corner;
          cubic_coeffs(uVar16,_w,piVar20,(float *)(piVar23 + lVar40),iVar24);
          cubic_coeffs(uVar31,_h,piVar23,local_38,iVar24);
          piVar17 = piVar20;
          if (0 < (int)_c) {
            uVar34 = 0;
            local_188 = piVar20;
            do {
              local_100._4_4_ = pMVar5->w;
              iStack_f8 = pMVar5->h;
              if (pMVar5->dims == 3) {
                sVar6 = pMVar5->elemsize;
                local_128 = (void *)(pMVar5->cstep * uVar34 * sVar6 + (long)pMVar5->data);
                local_110 = pMVar5->elempack;
                local_108 = pMVar5->allocator;
                local_118 = (undefined4)sVar6;
                uStack_114 = (undefined4)(sVar6 >> 0x20);
                local_100._0_4_ = 2;
                iStack_f0 = 1;
              }
              else {
                iStack_f0 = pMVar5->d;
                sVar6 = pMVar5->elemsize;
                local_128 = (void *)(pMVar5->cstep * uVar34 * sVar6 + (long)pMVar5->data);
                local_110 = pMVar5->elempack;
                local_108 = pMVar5->allocator;
                local_118 = (undefined4)sVar6;
                uStack_114 = (undefined4)(sVar6 >> 0x20);
                local_100._0_4_ = 3;
              }
              uStack_f4 = 1;
              uStack_11c = 0;
              uStack_120 = 0;
              local_e8 = (long)iStack_f8 * (long)local_100._4_4_;
              if (this_00->dims == 3) {
                uVar16 = this_00->w;
                sVar6 = this_00->elemsize;
                local_178 = (void *)(this_00->cstep * uVar34 * sVar6 + (long)this_00->data);
                uVar31 = this_00->h;
                local_160 = this_00->elempack;
                local_158 = this_00->allocator;
                local_168 = (undefined4)sVar6;
                uStack_164 = (undefined4)(sVar6 >> 0x20);
                local_150._0_4_ = 2;
                iStack_140 = 1;
              }
              else {
                uVar16 = this_00->w;
                uVar31 = this_00->h;
                iStack_140 = this_00->d;
                sVar6 = this_00->elemsize;
                local_178 = (void *)(this_00->cstep * uVar34 * sVar6 + (long)this_00->data);
                local_160 = this_00->elempack;
                local_158 = this_00->allocator;
                local_168 = (undefined4)sVar6;
                uStack_164 = (undefined4)(sVar6 >> 0x20);
                local_150._0_4_ = 3;
              }
              uStack_144 = 1;
              uStack_16c = 0;
              uStack_170 = 0;
              local_138 = (long)(int)uVar31 * (long)(int)uVar16;
              local_d8.cstep = 0;
              local_d8.data = (void *)0x0;
              local_d8.refcount._0_4_ = 0;
              local_d8.refcount._4_4_ = 0;
              local_d8.elemsize._0_4_ = 0;
              local_d8._20_8_ = 0;
              local_d8.h = 0;
              local_d8.d = 0;
              local_d8.c = 0;
              local_d8.allocator = (Allocator *)0x0;
              local_d8.dims = 0;
              local_d8.w = 0;
              uStack_148 = uVar31;
              local_150._4_4_ = uVar16;
              Mat::create(&local_d8,uVar16,4,(Allocator *)0x0);
              local_88.cstep = 0;
              local_88.data = (void *)0x0;
              local_88.refcount._0_4_ = 0;
              local_88.refcount._4_4_ = 0;
              local_88.elemsize._0_4_ = 0;
              local_88._20_8_ = 0;
              local_88.h = 0;
              local_88.d = 0;
              local_88.c = 0;
              local_88.allocator = (Allocator *)0x0;
              local_88.dims = 0;
              local_88.w = 0;
              Mat::create(&local_88,uVar16,4,(Allocator *)0x0);
              local_1d8.cstep = 0;
              local_1d8.data = (void *)0x0;
              local_1d8.refcount._0_4_ = 0;
              local_1d8.refcount._4_4_ = 0;
              local_1d8.elemsize._0_4_ = 0;
              local_1d8.elemsize._4_4_ = 0;
              local_1d8.elempack = 0;
              local_1d8.h = 0;
              local_1d8.d = 0;
              local_1d8.c = 0;
              local_1d8.allocator = (Allocator *)0x0;
              local_1d8.dims = 0;
              local_1d8.w = 0;
              Mat::create(&local_1d8,uVar16,4,(Allocator *)0x0);
              local_228.cstep = 0;
              local_228.data = (void *)0x0;
              local_228.refcount._0_4_ = 0;
              local_228.refcount._4_4_ = 0;
              local_228.elemsize._0_4_ = 0;
              local_228.elemsize._4_4_ = 0;
              local_228.elempack = 0;
              local_228.h = 0;
              local_228.d = 0;
              local_228.c = 0;
              local_228.allocator = (Allocator *)0x0;
              local_228.dims = 0;
              local_228.w = 0;
              Mat::create(&local_228,uVar16,4,(Allocator *)0x0);
              if (0 < (int)uVar31) {
                lVar26 = (long)local_100._4_4_ * CONCAT44(uStack_114,local_118);
                lVar19 = (ulong)uVar16 * 4;
                uVar35 = 0;
                pvVar22 = local_228.data;
                pvVar30 = local_178;
                pvVar32 = local_88.data;
                pvVar25 = local_d8.data;
                pfVar41 = local_38;
                pvVar46 = local_1d8.data;
                iVar24 = -3;
                do {
                  iVar50 = piVar23[uVar35];
                  pvVar14 = pvVar22;
                  pvVar36 = pvVar25;
                  pvVar15 = pvVar32;
                  pvVar45 = pvVar46;
                  if (iVar50 != iVar24) {
                    lVar21 = (long)iVar50;
                    if (iVar50 == iVar24 + 1) {
                      pvVar14 = pvVar25;
                      pvVar36 = pvVar32;
                      pvVar15 = pvVar46;
                      pvVar45 = pvVar22;
                      if (0 < (int)uVar16) {
                        lVar42 = 0;
                        do {
                          pfVar38 = (float *)(piVar20 + lVar43 + lVar40 + lVar42);
                          pfVar1 = (float *)((long)local_128 +
                                            (long)*(int *)((long)piVar17 + lVar42) * 4 +
                                            (lVar21 + 2) * lVar26 + -4);
                          *(float *)((long)pvVar25 + lVar42) =
                               pfVar1[3] * pfVar38[3] + pfVar1[1] * pfVar38[1] +
                               pfVar1[2] * pfVar38[2] + *pfVar1 * *pfVar38;
                          lVar42 = lVar42 + 4;
                        } while (lVar19 - lVar42 != 0);
                      }
                    }
                    else if (iVar50 == iVar24 + 2) {
                      pvVar14 = pvVar32;
                      pvVar36 = pvVar46;
                      pvVar15 = pvVar22;
                      pvVar45 = pvVar25;
                      if (0 < (int)uVar16) {
                        lVar42 = 0;
                        do {
                          iVar24 = *(int *)((long)piVar17 + lVar42);
                          pfVar38 = (float *)(piVar20 + lVar43 + lVar40 + lVar42);
                          fVar47 = *pfVar38;
                          fVar48 = pfVar38[1];
                          fVar8 = pfVar38[2];
                          fVar9 = pfVar38[3];
                          pfVar38 = (float *)((long)local_128 +
                                             (long)iVar24 * 4 + (lVar21 + 1) * lVar26 + -4);
                          *(float *)((long)pvVar25 + lVar42) =
                               pfVar38[3] * fVar9 + pfVar38[1] * fVar48 +
                               pfVar38[2] * fVar8 + *pfVar38 * fVar47;
                          pfVar38 = (float *)((long)local_128 +
                                             (long)iVar24 * 4 + (iVar50 + 2) * lVar26 + -4);
                          *(float *)((long)pvVar32 + lVar42) =
                               pfVar38[3] * fVar9 + pfVar38[1] * fVar48 +
                               pfVar38[2] * fVar8 + *pfVar38 * fVar47;
                          lVar42 = lVar42 + 4;
                        } while (lVar19 - lVar42 != 0);
                      }
                    }
                    else if (iVar50 == iVar24 + 3) {
                      pvVar14 = pvVar46;
                      pvVar36 = pvVar22;
                      pvVar15 = pvVar25;
                      pvVar45 = pvVar32;
                      if (0 < (int)uVar16) {
                        lVar42 = 0;
                        do {
                          lVar44 = (long)*(int *)((long)piVar17 + lVar42);
                          pfVar38 = (float *)(piVar20 + lVar43 + lVar40 + lVar42);
                          fVar47 = *pfVar38;
                          fVar48 = pfVar38[1];
                          fVar8 = pfVar38[2];
                          fVar9 = pfVar38[3];
                          pfVar38 = (float *)((long)local_128 + lVar44 * 4 + lVar21 * lVar26 + -4);
                          *(float *)((long)pvVar25 + lVar42) =
                               pfVar38[3] * fVar9 + pfVar38[1] * fVar48 +
                               pfVar38[2] * fVar8 + *pfVar38 * fVar47;
                          pfVar38 = (float *)((long)local_128 +
                                             lVar44 * 4 + (iVar50 + 1) * lVar26 + -4);
                          *(float *)((long)pvVar32 + lVar42) =
                               pfVar38[3] * fVar9 + pfVar38[1] * fVar48 +
                               pfVar38[2] * fVar8 + *pfVar38 * fVar47;
                          pfVar38 = (float *)((long)local_128 +
                                             lVar44 * 4 + (iVar50 + 2) * lVar26 + -4);
                          *(float *)((long)pvVar46 + lVar42) =
                               pfVar38[3] * fVar9 + pfVar38[1] * fVar48 +
                               pfVar38[2] * fVar8 + *pfVar38 * fVar47;
                          lVar42 = lVar42 + 4;
                        } while (lVar19 - lVar42 != 0);
                      }
                    }
                    else if (0 < (int)uVar16) {
                      local_180 = (long)local_128 + (iVar50 + 1) * lVar26 + -4;
                      lVar42 = 0;
                      do {
                        lVar44 = (long)*(int *)((long)local_188 + lVar42);
                        pfVar38 = (float *)(piVar20 + lVar43 + lVar40 + lVar42);
                        fVar47 = *pfVar38;
                        fVar48 = pfVar38[1];
                        fVar8 = pfVar38[2];
                        fVar9 = pfVar38[3];
                        pfVar38 = (float *)((long)local_128 +
                                           lVar44 * 4 + (lVar21 + -1) * lVar26 + -4);
                        *(float *)((long)pvVar25 + lVar42) =
                             pfVar38[3] * fVar9 + pfVar38[1] * fVar48 +
                             pfVar38[2] * fVar8 + *pfVar38 * fVar47;
                        pfVar38 = (float *)((long)local_128 + lVar44 * 4 + lVar21 * lVar26 + -4);
                        *(float *)((long)pvVar32 + lVar42) =
                             pfVar38[3] * fVar9 + pfVar38[1] * fVar48 +
                             pfVar38[2] * fVar8 + *pfVar38 * fVar47;
                        pfVar38 = (float *)(local_180 + lVar44 * 4);
                        *(float *)((long)pvVar46 + lVar42) =
                             pfVar38[3] * fVar9 + pfVar38[1] * fVar48 +
                             pfVar38[2] * fVar8 + *pfVar38 * fVar47;
                        pfVar38 = (float *)((long)local_128 +
                                           lVar44 * 4 + (iVar50 + 2) * lVar26 + -4);
                        *(float *)((long)pvVar22 + lVar42) =
                             pfVar38[3] * fVar9 + pfVar38[1] * fVar48 +
                             pfVar38[2] * fVar8 + *pfVar38 * fVar47;
                        lVar42 = lVar42 + 4;
                      } while (lVar19 - lVar42 != 0);
                    }
                  }
                  pvVar32 = pvVar15;
                  pvVar22 = pvVar14;
                  if (0 < (int)uVar16) {
                    fVar47 = *pfVar41;
                    fVar48 = pfVar41[1];
                    fVar8 = pfVar41[2];
                    fVar9 = pfVar41[3];
                    lVar21 = 0;
                    do {
                      *(float *)((long)pvVar30 + lVar21 * 4) =
                           *(float *)((long)pvVar22 + lVar21 * 4) * fVar9 +
                           *(float *)((long)pvVar32 + lVar21 * 4) * fVar48 +
                           *(float *)((long)pvVar45 + lVar21 * 4) * fVar8 +
                           *(float *)((long)pvVar36 + lVar21 * 4) * fVar47;
                      lVar21 = lVar21 + 1;
                    } while (uVar16 != (uint)lVar21);
                  }
                  pfVar41 = pfVar41 + 4;
                  uVar35 = uVar35 + 1;
                  pvVar30 = (void *)((long)pvVar30 +
                                    (long)(int)local_150._4_4_ * CONCAT44(uStack_164,local_168));
                  pvVar25 = pvVar36;
                  piVar17 = local_188;
                  pvVar46 = pvVar45;
                  iVar24 = iVar50;
                } while (uVar35 != uVar31);
              }
              piVar10 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
              if (piVar10 != (int *)0x0) {
                LOCK();
                *piVar10 = *piVar10 + -1;
                UNLOCK();
                if (*piVar10 == 0) {
                  if (local_228.allocator == (Allocator *)0x0) {
                    if (local_228.data != (void *)0x0) {
                      free(local_228.data);
                    }
                  }
                  else {
                    (*(local_228.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_228.cstep = 0;
              local_228.data = (void *)0x0;
              local_228.refcount._0_4_ = 0;
              local_228.refcount._4_4_ = 0;
              local_228.elemsize._0_4_ = 0;
              local_228.elemsize._4_4_ = 0;
              local_228.elempack = 0;
              local_228.dims = 0;
              local_228.w = 0;
              local_228.h = 0;
              local_228.d = 0;
              local_228.c = 0;
              piVar10 = (int *)CONCAT44(local_1d8.refcount._4_4_,local_1d8.refcount._0_4_);
              if (piVar10 != (int *)0x0) {
                LOCK();
                *piVar10 = *piVar10 + -1;
                UNLOCK();
                if (*piVar10 == 0) {
                  if (local_1d8.allocator == (Allocator *)0x0) {
                    if (local_1d8.data != (void *)0x0) {
                      free(local_1d8.data);
                    }
                  }
                  else {
                    (*(local_1d8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_1d8.cstep = 0;
              local_1d8.data = (void *)0x0;
              local_1d8.refcount._0_4_ = 0;
              local_1d8.refcount._4_4_ = 0;
              local_1d8.elemsize._0_4_ = 0;
              local_1d8.elemsize._4_4_ = 0;
              local_1d8.elempack = 0;
              local_1d8.dims = 0;
              local_1d8.w = 0;
              local_1d8.h = 0;
              local_1d8.d = 0;
              local_1d8.c = 0;
              piVar10 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
              if (piVar10 != (int *)0x0) {
                LOCK();
                *piVar10 = *piVar10 + -1;
                UNLOCK();
                if (*piVar10 == 0) {
                  if (local_88.allocator == (Allocator *)0x0) {
                    if (local_88.data != (void *)0x0) {
                      free(local_88.data);
                    }
                  }
                  else {
                    (*(local_88.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_88.cstep = 0;
              local_88.data = (void *)0x0;
              local_88.refcount._0_4_ = 0;
              local_88.refcount._4_4_ = 0;
              local_88.elemsize._0_4_ = 0;
              local_88._20_8_ = 0;
              local_88.dims = 0;
              local_88.w = 0;
              local_88.h = 0;
              local_88.d = 0;
              local_88.c = 0;
              piVar10 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
              if (piVar10 != (int *)0x0) {
                LOCK();
                *piVar10 = *piVar10 + -1;
                UNLOCK();
                if (*piVar10 == 0) {
                  if (local_d8.allocator == (Allocator *)0x0) {
                    if (local_d8.data != (void *)0x0) {
                      free(local_d8.data);
                    }
                  }
                  else {
                    (*(local_d8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_d8.cstep = 0;
              local_d8.data = (void *)0x0;
              local_d8.refcount._0_4_ = 0;
              local_d8.refcount._4_4_ = 0;
              local_d8.elemsize._0_4_ = 0;
              local_d8._20_8_ = 0;
              local_d8.dims = 0;
              local_d8.w = 0;
              local_d8.h = 0;
              local_d8.d = 0;
              local_d8.c = 0;
              piVar10 = (int *)CONCAT44(uStack_16c,uStack_170);
              if (piVar10 != (int *)0x0) {
                LOCK();
                *piVar10 = *piVar10 + -1;
                UNLOCK();
                if (*piVar10 == 0) {
                  if (local_158 == (Allocator *)0x0) {
                    if (local_178 != (void *)0x0) {
                      free(local_178);
                    }
                  }
                  else {
                    (*local_158->_vptr_Allocator[3])();
                  }
                }
              }
              local_138 = 0;
              local_178 = (void *)0x0;
              uStack_170 = 0;
              uStack_16c = 0;
              local_168 = 0;
              uStack_164 = 0;
              local_160 = 0;
              local_150 = 0;
              uStack_148 = 0;
              uStack_144 = 0;
              iStack_140 = 0;
              piVar10 = (int *)CONCAT44(uStack_11c,uStack_120);
              if (piVar10 != (int *)0x0) {
                LOCK();
                *piVar10 = *piVar10 + -1;
                UNLOCK();
                if (*piVar10 == 0) {
                  if (local_108 == (Allocator *)0x0) {
                    if (local_128 != (void *)0x0) {
                      free(local_128);
                    }
                  }
                  else {
                    (*local_108->_vptr_Allocator[3])();
                  }
                }
              }
              local_e8 = 0;
              local_128 = (void *)0x0;
              uStack_120 = 0;
              uStack_11c = 0;
              local_118 = 0;
              uStack_114 = 0;
              local_110 = 0;
              local_100 = 0;
              iStack_f8 = 0;
              uStack_f4 = 0;
              iStack_f0 = 0;
              uVar34 = uVar34 + 1;
            } while (uVar34 != uVar27);
          }
          operator_delete__(piVar17);
          return 0;
        }
        return 0;
      }
      return -100;
    }
  }
  if (this_00 != pMVar5) {
    piVar23 = pMVar5->refcount;
    if (piVar23 != (int *)0x0) {
      LOCK();
      *piVar23 = *piVar23 + 1;
      UNLOCK();
    }
    piVar23 = this_00->refcount;
    if (piVar23 != (int *)0x0) {
      LOCK();
      *piVar23 = *piVar23 + -1;
      UNLOCK();
      if (*piVar23 == 0) {
        if (this_00->allocator == (Allocator *)0x0) {
          if (this_00->data != (void *)0x0) {
            free(this_00->data);
          }
        }
        else {
          (*this_00->allocator->_vptr_Allocator[3])();
        }
      }
    }
    this_00->cstep = 0;
    this_00->data = (void *)0x0;
    this_00->refcount = (int *)0x0;
    *(undefined8 *)((long)&this_00->refcount + 4) = 0;
    *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
    this_00->dims = 0;
    this_00->w = 0;
    this_00->h = 0;
    this_00->d = 0;
    this_00->c = 0;
    piVar23 = pMVar5->refcount;
    this_00->data = pMVar5->data;
    this_00->refcount = piVar23;
    this_00->elemsize = pMVar5->elemsize;
    this_00->elempack = pMVar5->elempack;
    this_00->allocator = pMVar5->allocator;
    iVar24 = pMVar5->w;
    iVar50 = pMVar5->h;
    iVar33 = pMVar5->d;
    this_00->dims = pMVar5->dims;
    this_00->w = iVar24;
    this_00->h = iVar50;
    this_00->d = iVar33;
    this_00->c = pMVar5->c;
    this_00->cstep = pMVar5->cstep;
  }
  return 0;
}

Assistant:

int Interp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int outw = reference_blob.w;
    int outh = reference_blob.h;

    if (dims == 1)
    {
        // special case for 2d resize on flattened blob
        top_blob.create(outw, outh, w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < w; q++)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float v = bottom_blob[q];
            top_blob_c.fill(v);
        }

        return 0;
    }

    if (dims == 2)
    {
        if (outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(outw, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (resize_type == 1) // nearest
        {
            const float ws = outw ? w / (float)outw : 1.f / width_scale;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_x];
                }
            }
        }

        if (resize_type == 2) // bilinear
        {
            int* buf = new int[outw + outw * 2];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            linear_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    *outptr++ = Sp[0] * a0 + Sp[1] * a1;
                    alphap += 2;
                }
            }

            delete[] buf;
        }

        if (resize_type == 3) // bicubic
        {
            int* buf = new int[outw + outw * 4];

            int* xofs = buf;
            float* alpha = (float*)(buf + outw);

            cubic_coeffs(w, outw, xofs, alpha, align_corner);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.row(y);
                float* outptr = top_blob.row(y);
                const float* alphap = alpha;

                for (int x = 0; x < outw; x++)
                {
                    int sx = xofs[x];
                    const float* Sp = ptr + sx;
                    float a0 = alphap[0];
                    float a1 = alphap[1];
                    float a2 = alphap[2];
                    float a3 = alphap[3];
                    *outptr++ = Sp[-1] * a0 + Sp[0] * a1 + Sp[1] * a2 + Sp[2] * a3;
                    alphap += 4;
                }
            }

            delete[] buf;
        }

        return 0;
    }

    if (outw == w && outh == h)
    {
        top_blob = bottom_blob;
        return 0;
    }

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (resize_type == 1) // nearest
    {
        const float hs = outh ? h / (float)outh : 1.f / height_scale;
        const float ws = outw ? w / (float)outw : 1.f / width_scale;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            for (int y = 0; y < outh; y++)
            {
                int in_y = std::min((int)(y * hs), (h - 1));
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int)(x * ws), (w - 1));
                    *outptr++ = ptr[in_y * w + in_x];
                }
            }
        }
    }

    if (resize_type == 2) // bilinear
    {
        int* buf = new int[outw + outh + outw * 2 + outh * 2];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 2];
        float* beta = (float*)(buf + outw + outh + outw * 2); //new float[outh * 2];

        linear_coeffs(w, outw, xofs, alpha, align_corner);
        linear_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    if (resize_type == 3) // bicubic
    {
        int* buf = new int[outw + outh + outw * 4 + outh * 4];

        int* xofs = buf;        //new int[outw];
        int* yofs = buf + outw; //new int[outh];

        float* alpha = (float*)(buf + outw + outh);           //new float[outw * 4];
        float* beta = (float*)(buf + outw + outh + outw * 4); //new float[outh * 4];

        cubic_coeffs(w, outw, xofs, alpha, align_corner);
        cubic_coeffs(h, outh, yofs, beta, align_corner);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    return 0;
}